

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NeuralNetworkLayer::NeuralNetworkLayer
          (NeuralNetworkLayer *this,NeuralNetworkLayer *from)

{
  uint32 *puVar1;
  uint32 uVar2;
  void *pvVar3;
  string *initial_value;
  EmbeddingLayerParams *this_00;
  MultiplyBroadcastableLayerParams *this_01;
  RangeStaticLayerParams *this_02;
  ReduceLogSumExpLayerParams *this_03;
  ReduceLayerParams *this_04;
  ArgMinLayerParams *this_05;
  LessThanLayerParams *this_06;
  CategoricalDistributionLayerParams *this_07;
  TanLayerParams *this_08;
  CumSumLayerParams *this_09;
  CropResizeLayerParams *this_10;
  ScatterNDLayerParams *this_11;
  SimpleRecurrentLayerParams *this_12;
  BroadcastToStaticLayerParams *this_13;
  RandomUniformStaticLayerParams *this_14;
  AsinhLayerParams *this_15;
  SignLayerParams *this_16;
  WhereBroadcastableLayerParams *this_17;
  CoshLayerParams *this_18;
  MaxBroadcastableLayerParams *this_19;
  ReduceSumLayerParams *this_20;
  LRNLayerParams *this_21;
  ScatterLayerParams *this_22;
  ConcatLayerParams *this_23;
  LoadConstantNDLayerParams *this_24;
  ScaleLayerParams *this_25;
  TransposeLayerParams *this_26;
  CopyLayerParams *this_27;
  ReshapeLikeLayerParams *this_28;
  GeluLayerParams *this_29;
  ReshapeDynamicLayerParams *this_30;
  OneHotLayerParams *this_31;
  LoopLayerParams *this_32;
  ReduceMeanLayerParams *this_33;
  Exp2LayerParams *this_34;
  ClipLayerParams *this_35;
  MatrixBandPartLayerParams *this_36;
  AcosLayerParams *this_37;
  LogicalXorLayerParams *this_38;
  LogicalAndLayerParams *this_39;
  RandomBernoulliLikeLayerParams *this_40;
  ReduceL2LayerParams *this_41;
  AtanhLayerParams *this_42;
  NotEqualLayerParams *this_43;
  ConstantPaddingLayerParams *this_44;
  RandomNormalStaticLayerParams *this_45;
  PoolingLayerParams *this_46;
  PowBroadcastableLayerParams *this_47;
  MaxLayerParams *this_48;
  SliceDynamicLayerParams *this_49;
  PaddingLayerParams *this_50;
  SequenceRepeatLayerParams *this_51;
  FillStaticLayerParams *this_52;
  MeanVarianceNormalizeLayerParams *this_53;
  TileLayerParams *this_54;
  ReshapeLayerParams *this_55;
  EmbeddingNDLayerParams *this_56;
  AddLayerParams *this_57;
  ReverseSeqLayerParams *this_58;
  UniDirectionalLSTMLayerParams *this_59;
  SqueezeLayerParams *this_60;
  GatherNDLayerParams *this_61;
  GreaterThanLayerParams *this_62;
  GreaterEqualLayerParams *this_63;
  GatherAlongAxisLayerParams *this_64;
  ScatterAlongAxisLayerParams *this_65;
  LessEqualLayerParams *this_66;
  SoftmaxNDLayerParams *this_67;
  Convolution3DLayerParams *this_68;
  Pooling3DLayerParams *this_69;
  ArgSortLayerParams *this_70;
  SliceBySizeLayerParams *this_71;
  ClampedReLULayerParams *this_72;
  GlobalPooling3DLayerParams *this_73;
  LoopBreakLayerParams *this_74;
  ReduceLogSumLayerParams *this_75;
  SinLayerParams *this_76;
  CeilLayerParams *this_77;
  LowerTriangularLayerParams *this_78;
  AtanLayerParams *this_79;
  ModBroadcastableLayerParams *this_80;
  RandomBernoulliStaticLayerParams *this_81;
  ReduceMaxLayerParams *this_82;
  NonMaximumSuppressionLayerParams *this_83;
  BranchLayerParams *this_84;
  ReduceProdLayerParams *this_85;
  RoundLayerParams *this_86;
  RangeDynamicLayerParams *this_87;
  WhereNonZeroLayerParams *this_88;
  AsinLayerParams *this_89;
  LayerNormalizationLayerParams *this_90;
  LogicalNotLayerParams *this_91;
  RandomUniformDynamicLayerParams *this_92;
  ReduceL1LayerParams *this_93;
  LoopContinueLayerParams *this_94;
  ReduceSumSquareLayerParams *this_95;
  CosLayerParams *this_96;
  FloorLayerParams *this_97;
  UpperTriangularLayerParams *this_98;
  SinhLayerParams *this_99;
  RandomNormalDynamicLayerParams *this_x00100;
  MinBroadcastableLayerParams *this_x00101;
  RandomBernoulliDynamicLayerParams *this_x00102;
  ReduceMinLayerParams *this_x00103;
  ActivationParams *this_x00104;
  DivideBroadcastableLayerParams *this_x00105;
  MinLayerParams *this_x00106;
  SlidingWindowsLayerParams *this_x00107;
  UpsampleLayerParams *this_x00108;
  ReorganizeDataLayerParams *this_x00109;
  FillDynamicLayerParams *this_x00110;
  L2NormalizeLayerParams *this_x00111;
  StackLayerParams *this_x00112;
  FlattenLayerParams *this_x00113;
  BatchedMatMulLayerParams *this_x00114;
  MultiplyLayerParams *this_x00115;
  SplitNDLayerParams *this_x00116;
  BiDirectionalLSTMLayerParams *this_x00117;
  ExpandDimsLayerParams *this_x00118;
  TanhLayerParams *this_x00119;
  ErfLayerParams *this_x00120;
  AcoshLayerParams *this_x00121;
  EqualLayerParams *this_x00122;
  ReshapeStaticLayerParams *this_x00123;
  RankPreservingReshapeLayerParams *this_x00124;
  RandomNormalLikeLayerParams *this_x00125;
  RandomUniformLikeLayerParams *this_x00126;
  ConvolutionLayerParams *this_x00127;
  AddBroadcastableLayerParams *this_x00128;
  BiasLayerParams *this_x00129;
  SliceStaticLayerParams *this_x00130;
  CropLayerParams *this_x00131;
  SplitLayerParams *this_x00132;
  FillLikeLayerParams *this_x00133;
  BatchnormLayerParams *this_x00134;
  SubtractBroadcastableLayerParams *this_x00135;
  LoadConstantLayerParams *this_x00136;
  ArgMaxLayerParams *this_x00137;
  UnaryFunctionLayerParams *this_x00138;
  ReverseLayerParams *this_x00139;
  GRULayerParams *this_x00140;
  BroadcastToDynamicLayerParams *this_x00141;
  InnerProductLayerParams *this_x00142;
  FloorDivBroadcastableLayerParams *this_x00143;
  DotProductLayerParams *this_x00144;
  TopKLayerParams *this_x00145;
  ResizeBilinearLayerParams *this_x00146;
  SliceLayerParams *this_x00147;
  BroadcastToLikeLayerParams *this_x00148;
  SoftmaxLayerParams *this_x00149;
  GatherLayerParams *this_x00150;
  PermuteLayerParams *this_x00151;
  GetShapeLayerParams *this_x00152;
  AverageLayerParams *this_x00153;
  ConcatNDLayerParams *this_x00154;
  CustomLayerParams *this_x00155;
  FlattenTo2DLayerParams *this_x00156;
  LogicalOrLayerParams *this_x00157;
  LayerUnion LVar4;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NeuralNetworkLayer_00723188;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->input_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->input_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->input_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->input_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->input_).super_RepeatedPtrFieldBase,&(from->input_).super_RepeatedPtrFieldBase);
  (this->output_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->output_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->output_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->output_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->output_).super_RepeatedPtrFieldBase,&(from->output_).super_RepeatedPtrFieldBase
            );
  (this->inputtensor_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->inputtensor_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->inputtensor_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->inputtensor_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
            (&(this->inputtensor_).super_RepeatedPtrFieldBase,
             &(from->inputtensor_).super_RepeatedPtrFieldBase);
  (this->outputtensor_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->outputtensor_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->outputtensor_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->outputtensor_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
            (&(this->outputtensor_).super_RepeatedPtrFieldBase,
             &(from->outputtensor_).super_RepeatedPtrFieldBase);
  this->_cached_size_ = 0;
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  initial_value = (from->name_).ptr_;
  if ((initial_value != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
      ) && (initial_value->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,initial_value);
  }
  this->isupdatable_ = from->isupdatable_;
  this->_oneof_case_[0] = 0;
  puVar1 = from->_oneof_case_;
  uVar2 = from->_oneof_case_[0];
  if ((int)uVar2 < 0x370) {
    if ((int)uVar2 < 0x25d) {
      if ((int)uVar2 < 0xfa) {
        if ((int)uVar2 < 0xbe) {
          if ((int)uVar2 < 0xa0) {
            if ((int)uVar2 < 0x82) {
              if (uVar2 == 100) {
                this_x00127 = mutable_convolution(this);
                if (*puVar1 == 100) {
                  LVar4 = from->layer_;
                }
                else {
                  protobuf_NeuralNetwork_2eproto::InitDefaults();
                  LVar4.convolution_ =
                       (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_;
                }
                ConvolutionLayerParams::MergeFrom(this_x00127,LVar4.convolution_);
              }
              else if (uVar2 == 0x78) {
                this_46 = mutable_pooling(this);
                if (*puVar1 == 0x78) {
                  LVar4 = from->layer_;
                }
                else {
                  protobuf_NeuralNetwork_2eproto::InitDefaults();
                  LVar4.convolution_ =
                       (ConvolutionLayerParams *)&_PoolingLayerParams_default_instance_;
                }
                PoolingLayerParams::MergeFrom(this_46,LVar4.pooling_);
              }
            }
            else if (uVar2 == 0x82) {
              this_x00104 = mutable_activation(this);
              if (*puVar1 == 0x82) {
                LVar4 = from->layer_;
              }
              else {
                protobuf_NeuralNetwork_2eproto::InitDefaults();
                LVar4.convolution_ = (ConvolutionLayerParams *)&_ActivationParams_default_instance_;
              }
              ActivationParams::MergeFrom(this_x00104,LVar4.activation_);
            }
            else if (uVar2 == 0x8c) {
              this_x00142 = mutable_innerproduct(this);
              if (*puVar1 == 0x8c) {
                LVar4 = from->layer_;
              }
              else {
                protobuf_NeuralNetwork_2eproto::InitDefaults();
                LVar4.convolution_ =
                     (ConvolutionLayerParams *)&_InnerProductLayerParams_default_instance_;
              }
              InnerProductLayerParams::MergeFrom(this_x00142,LVar4.innerproduct_);
            }
            else if (uVar2 == 0x96) {
              this_00 = mutable_embedding(this);
              if (*puVar1 == 0x96) {
                LVar4 = from->layer_;
              }
              else {
                protobuf_NeuralNetwork_2eproto::InitDefaults();
                LVar4.convolution_ =
                     (ConvolutionLayerParams *)&_EmbeddingLayerParams_default_instance_;
              }
              EmbeddingLayerParams::MergeFrom(this_00,LVar4.embedding_);
            }
          }
          else if ((int)uVar2 < 0xaa) {
            if (uVar2 == 0xa0) {
              this_x00134 = mutable_batchnorm(this);
              if (*puVar1 == 0xa0) {
                LVar4 = from->layer_;
              }
              else {
                protobuf_NeuralNetwork_2eproto::InitDefaults();
                LVar4.convolution_ =
                     (ConvolutionLayerParams *)&_BatchnormLayerParams_default_instance_;
              }
              BatchnormLayerParams::MergeFrom(this_x00134,LVar4.batchnorm_);
            }
            else if (uVar2 == 0xa5) {
              this_53 = mutable_mvn(this);
              if (*puVar1 == 0xa5) {
                LVar4 = from->layer_;
              }
              else {
                protobuf_NeuralNetwork_2eproto::InitDefaults();
                LVar4.convolution_ =
                     (ConvolutionLayerParams *)&_MeanVarianceNormalizeLayerParams_default_instance_;
              }
              MeanVarianceNormalizeLayerParams::MergeFrom(this_53,LVar4.mvn_);
            }
          }
          else if (uVar2 == 0xaa) {
            this_x00111 = mutable_l2normalize(this);
            if (*puVar1 == 0xaa) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_L2NormalizeLayerParams_default_instance_;
            }
            L2NormalizeLayerParams::MergeFrom(this_x00111,LVar4.l2normalize_);
          }
          else if (uVar2 == 0xaf) {
            this_x00149 = mutable_softmax(this);
            if (*puVar1 == 0xaf) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ = (ConvolutionLayerParams *)&_SoftmaxLayerParams_default_instance_;
            }
            SoftmaxLayerParams::MergeFrom(this_x00149,LVar4.softmax_);
          }
          else if (uVar2 == 0xb4) {
            this_21 = mutable_lrn(this);
            if (*puVar1 == 0xb4) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ = (ConvolutionLayerParams *)&_LRNLayerParams_default_instance_;
            }
            LRNLayerParams::MergeFrom(this_21,LVar4.lrn_);
          }
        }
        else if ((int)uVar2 < 0xdc) {
          if ((int)uVar2 < 0xd2) {
            if (uVar2 == 0xbe) {
              this_x00131 = mutable_crop(this);
              if (*puVar1 == 0xbe) {
                LVar4 = from->layer_;
              }
              else {
                protobuf_NeuralNetwork_2eproto::InitDefaults();
                LVar4.convolution_ = (ConvolutionLayerParams *)&_CropLayerParams_default_instance_;
              }
              CropLayerParams::MergeFrom(this_x00131,LVar4.crop_);
            }
            else if (uVar2 == 200) {
              this_50 = mutable_padding(this);
              if (*puVar1 == 200) {
                LVar4 = from->layer_;
              }
              else {
                protobuf_NeuralNetwork_2eproto::InitDefaults();
                LVar4.convolution_ =
                     (ConvolutionLayerParams *)&_PaddingLayerParams_default_instance_;
              }
              PaddingLayerParams::MergeFrom(this_50,LVar4.padding_);
            }
          }
          else if (uVar2 == 0xd2) {
            this_x00108 = mutable_upsample(this);
            if (*puVar1 == 0xd2) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ = (ConvolutionLayerParams *)&_UpsampleLayerParams_default_instance_
              ;
            }
            UpsampleLayerParams::MergeFrom(this_x00108,LVar4.upsample_);
          }
          else if (uVar2 == 0xd3) {
            this_x00146 = mutable_resizebilinear(this);
            if (*puVar1 == 0xd3) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_ResizeBilinearLayerParams_default_instance_;
            }
            ResizeBilinearLayerParams::MergeFrom(this_x00146,LVar4.resizebilinear_);
          }
          else if (uVar2 == 0xd4) {
            this_10 = mutable_cropresize(this);
            if (*puVar1 == 0xd4) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_CropResizeLayerParams_default_instance_;
            }
            CropResizeLayerParams::MergeFrom(this_10,LVar4.cropresize_);
          }
        }
        else if ((int)uVar2 < 0xe7) {
          if (uVar2 == 0xdc) {
            this_x00138 = mutable_unary(this);
            if (*puVar1 == 0xdc) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_UnaryFunctionLayerParams_default_instance_;
            }
            UnaryFunctionLayerParams::MergeFrom(this_x00138,LVar4.unary_);
          }
          else if (uVar2 == 0xe6) {
            this_57 = mutable_add(this);
            if (*puVar1 == 0xe6) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ = (ConvolutionLayerParams *)&_AddLayerParams_default_instance_;
            }
            AddLayerParams::MergeFrom(this_57,LVar4.add_);
          }
        }
        else if (uVar2 == 0xe7) {
          this_x00115 = mutable_multiply(this);
          if (*puVar1 == 0xe7) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_MultiplyLayerParams_default_instance_;
          }
          MultiplyLayerParams::MergeFrom(this_x00115,LVar4.multiply_);
        }
        else if (uVar2 == 0xf0) {
          this_x00153 = mutable_average(this);
          if (*puVar1 == 0xf0) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_AverageLayerParams_default_instance_;
          }
          AverageLayerParams::MergeFrom(this_x00153,LVar4.average_);
        }
        else if (uVar2 == 0xf5) {
          this_25 = mutable_scale(this);
          if (*puVar1 == 0xf5) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_ScaleLayerParams_default_instance_;
          }
          ScaleLayerParams::MergeFrom(this_25,LVar4.scale_);
        }
      }
      else if ((int)uVar2 < 0x14a) {
        if ((int)uVar2 < 0x122) {
          if ((int)uVar2 < 0x105) {
            if (uVar2 == 0xfa) {
              this_x00129 = mutable_bias(this);
              if (*puVar1 == 0xfa) {
                LVar4 = from->layer_;
              }
              else {
                protobuf_NeuralNetwork_2eproto::InitDefaults();
                LVar4.convolution_ = (ConvolutionLayerParams *)&_BiasLayerParams_default_instance_;
              }
              BiasLayerParams::MergeFrom(this_x00129,LVar4.bias_);
            }
            else if (uVar2 == 0x104) {
              this_48 = mutable_max(this);
              if (*puVar1 == 0x104) {
                LVar4 = from->layer_;
              }
              else {
                protobuf_NeuralNetwork_2eproto::InitDefaults();
                LVar4.convolution_ = (ConvolutionLayerParams *)&_MaxLayerParams_default_instance_;
              }
              MaxLayerParams::MergeFrom(this_48,LVar4.max_);
            }
          }
          else if (uVar2 == 0x105) {
            this_x00106 = mutable_min(this);
            if (*puVar1 == 0x105) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ = (ConvolutionLayerParams *)&_MinLayerParams_default_instance_;
            }
            MinLayerParams::MergeFrom(this_x00106,LVar4.min_);
          }
          else if (uVar2 == 0x10e) {
            this_x00144 = mutable_dot(this);
            if (*puVar1 == 0x10e) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_DotProductLayerParams_default_instance_;
            }
            DotProductLayerParams::MergeFrom(this_x00144,LVar4.dot_);
          }
          else if (uVar2 == 0x118) {
            this_04 = mutable_reduce(this);
            if (*puVar1 == 0x118) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ = (ConvolutionLayerParams *)&_ReduceLayerParams_default_instance_;
            }
            ReduceLayerParams::MergeFrom(this_04,LVar4.reduce_);
          }
        }
        else if ((int)uVar2 < 0x12d) {
          if (uVar2 == 0x122) {
            this_x00136 = mutable_loadconstant(this);
            if (*puVar1 == 0x122) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_LoadConstantLayerParams_default_instance_;
            }
            LoadConstantLayerParams::MergeFrom(this_x00136,LVar4.loadconstant_);
          }
          else if (uVar2 == 300) {
            this_55 = mutable_reshape(this);
            if (*puVar1 == 300) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ = (ConvolutionLayerParams *)&_ReshapeLayerParams_default_instance_;
            }
            ReshapeLayerParams::MergeFrom(this_55,LVar4.reshape_);
          }
        }
        else if (uVar2 == 0x12d) {
          this_x00113 = mutable_flatten(this);
          if (*puVar1 == 0x12d) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_FlattenLayerParams_default_instance_;
          }
          FlattenLayerParams::MergeFrom(this_x00113,LVar4.flatten_);
        }
        else if (uVar2 == 0x136) {
          this_x00151 = mutable_permute(this);
          if (*puVar1 == 0x136) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_PermuteLayerParams_default_instance_;
          }
          PermuteLayerParams::MergeFrom(this_x00151,LVar4.permute_);
        }
        else if (uVar2 == 0x140) {
          this_23 = mutable_concat(this);
          if (*puVar1 == 0x140) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_ConcatLayerParams_default_instance_;
          }
          ConcatLayerParams::MergeFrom(this_23,LVar4.concat_);
        }
      }
      else if ((int)uVar2 < 0x19a) {
        if ((int)uVar2 < 0x159) {
          if (uVar2 == 0x14a) {
            this_x00132 = mutable_split(this);
            if (*puVar1 == 0x14a) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ = (ConvolutionLayerParams *)&_SplitLayerParams_default_instance_;
            }
            SplitLayerParams::MergeFrom(this_x00132,LVar4.split_);
          }
          else if (uVar2 == 0x154) {
            this_51 = mutable_sequencerepeat(this);
            if (*puVar1 == 0x154) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_SequenceRepeatLayerParams_default_instance_;
            }
            SequenceRepeatLayerParams::MergeFrom(this_51,LVar4.sequencerepeat_);
          }
        }
        else if (uVar2 == 0x159) {
          this_x00109 = mutable_reorganizedata(this);
          if (*puVar1 == 0x159) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ =
                 (ConvolutionLayerParams *)&_ReorganizeDataLayerParams_default_instance_;
          }
          ReorganizeDataLayerParams::MergeFrom(this_x00109,LVar4.reorganizedata_);
        }
        else if (uVar2 == 0x15e) {
          this_x00147 = mutable_slice(this);
          if (*puVar1 == 0x15e) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_SliceLayerParams_default_instance_;
          }
          SliceLayerParams::MergeFrom(this_x00147,LVar4.slice_);
        }
        else if (uVar2 == 400) {
          this_12 = mutable_simplerecurrent(this);
          if (*puVar1 == 400) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ =
                 (ConvolutionLayerParams *)&_SimpleRecurrentLayerParams_default_instance_;
          }
          SimpleRecurrentLayerParams::MergeFrom(this_12,LVar4.simplerecurrent_);
        }
      }
      else if ((int)uVar2 < 0x1ae) {
        if (uVar2 == 0x19a) {
          this_x00140 = mutable_gru(this);
          if (*puVar1 == 0x19a) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_GRULayerParams_default_instance_;
          }
          GRULayerParams::MergeFrom(this_x00140,LVar4.gru_);
        }
        else if (uVar2 == 0x1a4) {
          this_59 = mutable_unidirectionallstm(this);
          if (*puVar1 == 0x1a4) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ =
                 (ConvolutionLayerParams *)&_UniDirectionalLSTMLayerParams_default_instance_;
          }
          UniDirectionalLSTMLayerParams::MergeFrom(this_59,LVar4.unidirectionallstm_);
        }
      }
      else if (uVar2 == 0x1ae) {
        this_x00117 = mutable_bidirectionallstm(this);
        if (*puVar1 == 0x1ae) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ =
               (ConvolutionLayerParams *)&_BiDirectionalLSTMLayerParams_default_instance_;
        }
        BiDirectionalLSTMLayerParams::MergeFrom(this_x00117,LVar4.bidirectionallstm_);
      }
      else if (uVar2 == 500) {
        this_x00155 = mutable_custom(this);
        if (*puVar1 == 500) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_CustomLayerParams_default_instance_;
        }
        CustomLayerParams::MergeFrom(this_x00155,LVar4.custom_);
      }
      else if (uVar2 == 600) {
        this_27 = mutable_copy(this);
        if (*puVar1 == 600) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_CopyLayerParams_default_instance_;
        }
        CopyLayerParams::MergeFrom(this_27,LVar4.copy_);
      }
    }
    else if ((int)uVar2 < 0x2f8) {
      if ((int)uVar2 < 0x2ad) {
        if ((int)uVar2 < 0x280) {
          if ((int)uVar2 < 0x26c) {
            if (uVar2 == 0x25d) {
              this_84 = mutable_branch(this);
              if (*puVar1 == 0x25d) {
                LVar4 = from->layer_;
              }
              else {
                protobuf_NeuralNetwork_2eproto::InitDefaults();
                LVar4.convolution_ = (ConvolutionLayerParams *)&_BranchLayerParams_default_instance_
                ;
              }
              BranchLayerParams::MergeFrom(this_84,LVar4.branch_);
            }
            else if (uVar2 == 0x267) {
              this_32 = mutable_loop(this);
              if (*puVar1 == 0x267) {
                LVar4 = from->layer_;
              }
              else {
                protobuf_NeuralNetwork_2eproto::InitDefaults();
                LVar4.convolution_ = (ConvolutionLayerParams *)&_LoopLayerParams_default_instance_;
              }
              LoopLayerParams::MergeFrom(this_32,LVar4.loop_);
            }
          }
          else if (uVar2 == 0x26c) {
            this_74 = mutable_loopbreak(this);
            if (*puVar1 == 0x26c) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_LoopBreakLayerParams_default_instance_;
            }
            LoopBreakLayerParams::MergeFrom(this_74,LVar4.loopbreak_);
          }
          else if (uVar2 == 0x271) {
            this_94 = mutable_loopcontinue(this);
            if (*puVar1 == 0x271) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_LoopContinueLayerParams_default_instance_;
            }
            LoopContinueLayerParams::MergeFrom(this_94,LVar4.loopcontinue_);
          }
          else if (uVar2 == 0x27b) {
            this_02 = mutable_rangestatic(this);
            if (*puVar1 == 0x27b) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_RangeStaticLayerParams_default_instance_;
            }
            RangeStaticLayerParams::MergeFrom(this_02,LVar4.rangestatic_);
          }
        }
        else if ((int)uVar2 < 0x299) {
          if (uVar2 == 0x280) {
            this_87 = mutable_rangedynamic(this);
            if (*puVar1 == 0x280) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_RangeDynamicLayerParams_default_instance_;
            }
            RangeDynamicLayerParams::MergeFrom(this_87,LVar4.rangedynamic_);
          }
          else if (uVar2 == 0x294) {
            this_35 = mutable_clip(this);
            if (*puVar1 == 0x294) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ = (ConvolutionLayerParams *)&_ClipLayerParams_default_instance_;
            }
            ClipLayerParams::MergeFrom(this_35,LVar4.clip_);
          }
        }
        else if (uVar2 == 0x299) {
          this_77 = mutable_ceil(this);
          if (*puVar1 == 0x299) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_CeilLayerParams_default_instance_;
          }
          CeilLayerParams::MergeFrom(this_77,LVar4.ceil_);
        }
        else if (uVar2 == 0x29e) {
          this_97 = mutable_floor(this);
          if (*puVar1 == 0x29e) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_FloorLayerParams_default_instance_;
          }
          FloorLayerParams::MergeFrom(this_97,LVar4.floor_);
        }
        else if (uVar2 == 0x2a8) {
          this_16 = mutable_sign(this);
          if (*puVar1 == 0x2a8) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_SignLayerParams_default_instance_;
          }
          SignLayerParams::MergeFrom(this_16,LVar4.sign_);
        }
      }
      else if ((int)uVar2 < 0x2da) {
        if ((int)uVar2 < 0x2c6) {
          if (uVar2 == 0x2ad) {
            this_86 = mutable_round(this);
            if (*puVar1 == 0x2ad) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ = (ConvolutionLayerParams *)&_RoundLayerParams_default_instance_;
            }
            RoundLayerParams::MergeFrom(this_86,LVar4.round_);
          }
          else if (uVar2 == 700) {
            this_34 = mutable_exp2(this);
            if (*puVar1 == 700) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ = (ConvolutionLayerParams *)&_Exp2LayerParams_default_instance_;
            }
            Exp2LayerParams::MergeFrom(this_34,LVar4.exp2_);
          }
        }
        else if (uVar2 == 0x2c6) {
          this_76 = mutable_sin(this);
          if (*puVar1 == 0x2c6) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_SinLayerParams_default_instance_;
          }
          SinLayerParams::MergeFrom(this_76,LVar4.sin_);
        }
        else if (uVar2 == 0x2cb) {
          this_96 = mutable_cos(this);
          if (*puVar1 == 0x2cb) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_CosLayerParams_default_instance_;
          }
          CosLayerParams::MergeFrom(this_96,LVar4.cos_);
        }
        else if (uVar2 == 0x2d0) {
          this_08 = mutable_tan(this);
          if (*puVar1 == 0x2d0) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_TanLayerParams_default_instance_;
          }
          TanLayerParams::MergeFrom(this_08,LVar4.tan_);
        }
      }
      else if ((int)uVar2 < 0x2e4) {
        if (uVar2 == 0x2da) {
          this_89 = mutable_asin(this);
          if (*puVar1 == 0x2da) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_AsinLayerParams_default_instance_;
          }
          AsinLayerParams::MergeFrom(this_89,LVar4.asin_);
        }
        else if (uVar2 == 0x2df) {
          this_37 = mutable_acos(this);
          if (*puVar1 == 0x2df) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_AcosLayerParams_default_instance_;
          }
          AcosLayerParams::MergeFrom(this_37,LVar4.acos_);
        }
      }
      else if (uVar2 == 0x2e4) {
        this_79 = mutable_atan(this);
        if (*puVar1 == 0x2e4) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_AtanLayerParams_default_instance_;
        }
        AtanLayerParams::MergeFrom(this_79,LVar4.atan_);
      }
      else if (uVar2 == 0x2ee) {
        this_99 = mutable_sinh(this);
        if (*puVar1 == 0x2ee) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_SinhLayerParams_default_instance_;
        }
        SinhLayerParams::MergeFrom(this_99,LVar4.sinh_);
      }
      else if (uVar2 == 0x2f3) {
        this_18 = mutable_cosh(this);
        if (*puVar1 == 0x2f3) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_CoshLayerParams_default_instance_;
        }
        CoshLayerParams::MergeFrom(this_18,LVar4.cosh_);
      }
    }
    else if ((int)uVar2 < 0x339) {
      if ((int)uVar2 < 0x316) {
        if ((int)uVar2 < 0x307) {
          if (uVar2 == 0x2f8) {
            this_x00119 = mutable_tanh(this);
            if (*puVar1 == 0x2f8) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ = (ConvolutionLayerParams *)&_TanhLayerParams_default_instance_;
            }
            TanhLayerParams::MergeFrom(this_x00119,LVar4.tanh_);
          }
          else if (uVar2 == 0x302) {
            this_15 = mutable_asinh(this);
            if (*puVar1 == 0x302) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ = (ConvolutionLayerParams *)&_AsinhLayerParams_default_instance_;
            }
            AsinhLayerParams::MergeFrom(this_15,LVar4.asinh_);
          }
        }
        else if (uVar2 == 0x307) {
          this_x00121 = mutable_acosh(this);
          if (*puVar1 == 0x307) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_AcoshLayerParams_default_instance_;
          }
          AcoshLayerParams::MergeFrom(this_x00121,LVar4.acosh_);
        }
        else if (uVar2 == 0x30c) {
          this_42 = mutable_atanh(this);
          if (*puVar1 == 0x30c) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_AtanhLayerParams_default_instance_;
          }
          AtanhLayerParams::MergeFrom(this_42,LVar4.atanh_);
        }
      }
      else if ((int)uVar2 < 0x32f) {
        if (uVar2 == 0x316) {
          this_x00120 = mutable_erf(this);
          if (*puVar1 == 0x316) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_ErfLayerParams_default_instance_;
          }
          ErfLayerParams::MergeFrom(this_x00120,LVar4.erf_);
        }
        else if (uVar2 == 0x31b) {
          this_29 = mutable_gelu(this);
          if (*puVar1 == 0x31b) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_GeluLayerParams_default_instance_;
          }
          GeluLayerParams::MergeFrom(this_29,LVar4.gelu_);
        }
      }
      else if (uVar2 == 0x32f) {
        this_x00122 = mutable_equal(this);
        if (*puVar1 == 0x32f) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_EqualLayerParams_default_instance_;
        }
        EqualLayerParams::MergeFrom(this_x00122,LVar4.equal_);
      }
      else if (uVar2 == 0x334) {
        this_43 = mutable_notequal(this);
        if (*puVar1 == 0x334) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_NotEqualLayerParams_default_instance_;
        }
        NotEqualLayerParams::MergeFrom(this_43,LVar4.notequal_);
      }
    }
    else if ((int)uVar2 < 0x352) {
      switch(uVar2) {
      case 0x339:
        this_06 = mutable_lessthan(this);
        if (*puVar1 == 0x339) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_LessThanLayerParams_default_instance_;
        }
        LessThanLayerParams::MergeFrom(this_06,LVar4.lessthan_);
        break;
      case 0x33a:
      case 0x33c:
      case 0x33d:
      case 0x33f:
        break;
      case 0x33b:
        this_66 = mutable_lessequal(this);
        if (*puVar1 == 0x33b) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_LessEqualLayerParams_default_instance_;
        }
        LessEqualLayerParams::MergeFrom(this_66,LVar4.lessequal_);
        break;
      case 0x33e:
        this_62 = mutable_greaterthan(this);
        if (*puVar1 == 0x33e) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_GreaterThanLayerParams_default_instance_;
        }
        GreaterThanLayerParams::MergeFrom(this_62,LVar4.greaterthan_);
        break;
      case 0x340:
        this_63 = mutable_greaterequal(this);
        if (*puVar1 == 0x340) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_GreaterEqualLayerParams_default_instance_
          ;
        }
        GreaterEqualLayerParams::MergeFrom(this_63,LVar4.greaterequal_);
        break;
      default:
        if (uVar2 == 0x348) {
          this_x00157 = mutable_logicalor(this);
          if (*puVar1 == 0x348) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_LogicalOrLayerParams_default_instance_;
          }
          LogicalOrLayerParams::MergeFrom(this_x00157,LVar4.logicalor_);
        }
        else if (uVar2 == 0x34d) {
          this_38 = mutable_logicalxor(this);
          if (*puVar1 == 0x34d) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_LogicalXorLayerParams_default_instance_
            ;
          }
          LogicalXorLayerParams::MergeFrom(this_38,LVar4.logicalxor_);
        }
      }
    }
    else if ((int)uVar2 < 0x361) {
      if (uVar2 == 0x352) {
        this_91 = mutable_logicalnot(this);
        if (*puVar1 == 0x352) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_LogicalNotLayerParams_default_instance_;
        }
        LogicalNotLayerParams::MergeFrom(this_91,LVar4.logicalnot_);
      }
      else if (uVar2 == 0x357) {
        this_39 = mutable_logicaland(this);
        if (*puVar1 == 0x357) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_LogicalAndLayerParams_default_instance_;
        }
        LogicalAndLayerParams::MergeFrom(this_39,LVar4.logicaland_);
      }
    }
    else if (uVar2 == 0x361) {
      this_80 = mutable_modbroadcastable(this);
      if (*puVar1 == 0x361) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ =
             (ConvolutionLayerParams *)&_ModBroadcastableLayerParams_default_instance_;
      }
      ModBroadcastableLayerParams::MergeFrom(this_80,LVar4.modbroadcastable_);
    }
    else if (uVar2 == 0x366) {
      this_x00101 = mutable_minbroadcastable(this);
      if (*puVar1 == 0x366) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ =
             (ConvolutionLayerParams *)&_MinBroadcastableLayerParams_default_instance_;
      }
      MinBroadcastableLayerParams::MergeFrom(this_x00101,LVar4.minbroadcastable_);
    }
    else if (uVar2 == 0x36b) {
      this_19 = mutable_maxbroadcastable(this);
      if (*puVar1 == 0x36b) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ =
             (ConvolutionLayerParams *)&_MaxBroadcastableLayerParams_default_instance_;
      }
      MaxBroadcastableLayerParams::MergeFrom(this_19,LVar4.maxbroadcastable_);
    }
  }
  else if ((int)uVar2 < 0x474) {
    if ((int)uVar2 < 0x3e3) {
      if ((int)uVar2 < 0x3ac) {
        if ((int)uVar2 < 0x389) {
          if ((int)uVar2 < 0x37a) {
            if (uVar2 == 0x370) {
              this_x00128 = mutable_addbroadcastable(this);
              if (*puVar1 == 0x370) {
                LVar4 = from->layer_;
              }
              else {
                protobuf_NeuralNetwork_2eproto::InitDefaults();
                LVar4.convolution_ =
                     (ConvolutionLayerParams *)&_AddBroadcastableLayerParams_default_instance_;
              }
              AddBroadcastableLayerParams::MergeFrom(this_x00128,LVar4.addbroadcastable_);
            }
            else if (uVar2 == 0x375) {
              this_47 = mutable_powbroadcastable(this);
              if (*puVar1 == 0x375) {
                LVar4 = from->layer_;
              }
              else {
                protobuf_NeuralNetwork_2eproto::InitDefaults();
                LVar4.convolution_ =
                     (ConvolutionLayerParams *)&_PowBroadcastableLayerParams_default_instance_;
              }
              PowBroadcastableLayerParams::MergeFrom(this_47,LVar4.powbroadcastable_);
            }
          }
          else if (uVar2 == 0x37a) {
            this_x00105 = mutable_dividebroadcastable(this);
            if (*puVar1 == 0x37a) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_DivideBroadcastableLayerParams_default_instance_;
            }
            DivideBroadcastableLayerParams::MergeFrom(this_x00105,LVar4.dividebroadcastable_);
          }
          else if (uVar2 == 0x37f) {
            this_x00143 = mutable_floordivbroadcastable(this);
            if (*puVar1 == 0x37f) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_FloorDivBroadcastableLayerParams_default_instance_;
            }
            FloorDivBroadcastableLayerParams::MergeFrom(this_x00143,LVar4.floordivbroadcastable_);
          }
          else if (uVar2 == 900) {
            this_01 = mutable_multiplybroadcastable(this);
            if (*puVar1 == 900) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_MultiplyBroadcastableLayerParams_default_instance_;
            }
            MultiplyBroadcastableLayerParams::MergeFrom(this_01,LVar4.multiplybroadcastable_);
          }
        }
        else if ((int)uVar2 < 0x39d) {
          if (uVar2 == 0x389) {
            this_x00135 = mutable_subtractbroadcastable(this);
            if (*puVar1 == 0x389) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_SubtractBroadcastableLayerParams_default_instance_;
            }
            SubtractBroadcastableLayerParams::MergeFrom(this_x00135,LVar4.subtractbroadcastable_);
          }
          else if (uVar2 == 0x398) {
            this_54 = mutable_tile(this);
            if (*puVar1 == 0x398) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ = (ConvolutionLayerParams *)&_TileLayerParams_default_instance_;
            }
            TileLayerParams::MergeFrom(this_54,LVar4.tile_);
          }
        }
        else if (uVar2 == 0x39d) {
          this_x00112 = mutable_stack(this);
          if (*puVar1 == 0x39d) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_StackLayerParams_default_instance_;
          }
          StackLayerParams::MergeFrom(this_x00112,LVar4.stack_);
        }
        else if (uVar2 == 0x3a2) {
          this_x00150 = mutable_gather(this);
          if (*puVar1 == 0x3a2) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_GatherLayerParams_default_instance_;
          }
          GatherLayerParams::MergeFrom(this_x00150,LVar4.gather_);
        }
        else if (uVar2 == 0x3a7) {
          this_22 = mutable_scatter(this);
          if (*puVar1 == 0x3a7) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_ScatterLayerParams_default_instance_;
          }
          ScatterLayerParams::MergeFrom(this_22,LVar4.scatter_);
        }
      }
      else if ((int)uVar2 < 0x3c0) {
        switch(uVar2) {
        case 0x3b1:
          this_11 = mutable_scatternd(this);
          if (*puVar1 == 0x3b1) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_ScatterNDLayerParams_default_instance_;
          }
          ScatterNDLayerParams::MergeFrom(this_11,LVar4.scatternd_);
          break;
        case 0x3b2:
        case 0x3b3:
        case 0x3b4:
        case 0x3b5:
        case 0x3b7:
        case 0x3b9:
          break;
        case 0x3b6:
          this_67 = mutable_softmaxnd(this);
          if (*puVar1 == 0x3b6) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_SoftmaxNDLayerParams_default_instance_;
          }
          SoftmaxNDLayerParams::MergeFrom(this_67,LVar4.softmaxnd_);
          break;
        case 0x3b8:
          this_64 = mutable_gatheralongaxis(this);
          if (*puVar1 == 0x3b8) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ =
                 (ConvolutionLayerParams *)&_GatherAlongAxisLayerParams_default_instance_;
          }
          GatherAlongAxisLayerParams::MergeFrom(this_64,LVar4.gatheralongaxis_);
          break;
        case 0x3ba:
          this_65 = mutable_scatteralongaxis(this);
          if (*puVar1 == 0x3ba) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ =
                 (ConvolutionLayerParams *)&_ScatterAlongAxisLayerParams_default_instance_;
          }
          ScatterAlongAxisLayerParams::MergeFrom(this_65,LVar4.scatteralongaxis_);
          break;
        default:
          if (uVar2 == 0x3ac) {
            this_61 = mutable_gathernd(this);
            if (*puVar1 == 0x3ac) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ = (ConvolutionLayerParams *)&_GatherNDLayerParams_default_instance_
              ;
            }
            GatherNDLayerParams::MergeFrom(this_61,LVar4.gathernd_);
          }
        }
      }
      else if ((int)uVar2 < 0x3cf) {
        if (uVar2 == 0x3c0) {
          this_x00139 = mutable_reverse(this);
          if (*puVar1 == 0x3c0) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_ReverseLayerParams_default_instance_;
          }
          ReverseLayerParams::MergeFrom(this_x00139,LVar4.reverse_);
        }
        else if (uVar2 == 0x3c5) {
          this_58 = mutable_reverseseq(this);
          if (*puVar1 == 0x3c5) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_ReverseSeqLayerParams_default_instance_
            ;
          }
          ReverseSeqLayerParams::MergeFrom(this_58,LVar4.reverseseq_);
        }
      }
      else if (uVar2 == 0x3cf) {
        this_x00116 = mutable_splitnd(this);
        if (*puVar1 == 0x3cf) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_SplitNDLayerParams_default_instance_;
        }
        SplitNDLayerParams::MergeFrom(this_x00116,LVar4.splitnd_);
      }
      else if (uVar2 == 0x3d4) {
        this_x00154 = mutable_concatnd(this);
        if (*puVar1 == 0x3d4) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_ConcatNDLayerParams_default_instance_;
        }
        ConcatNDLayerParams::MergeFrom(this_x00154,LVar4.concatnd_);
      }
      else if (uVar2 == 0x3d9) {
        this_26 = mutable_transpose(this);
        if (*puVar1 == 0x3d9) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_TransposeLayerParams_default_instance_;
        }
        TransposeLayerParams::MergeFrom(this_26,LVar4.transpose_);
      }
    }
    else if ((int)uVar2 < 0x438) {
      if ((int)uVar2 < 0x401) {
        if ((int)uVar2 < 0x3ed) {
          if (uVar2 == 0x3e3) {
            this_x00130 = mutable_slicestatic(this);
            if (*puVar1 == 0x3e3) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_SliceStaticLayerParams_default_instance_;
            }
            SliceStaticLayerParams::MergeFrom(this_x00130,LVar4.slicestatic_);
          }
          else if (uVar2 == 1000) {
            this_49 = mutable_slicedynamic(this);
            if (*puVar1 == 1000) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_SliceDynamicLayerParams_default_instance_;
            }
            SliceDynamicLayerParams::MergeFrom(this_49,LVar4.slicedynamic_);
          }
        }
        else if (uVar2 == 0x3ed) {
          this_x00107 = mutable_slidingwindows(this);
          if (*puVar1 == 0x3ed) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ =
                 (ConvolutionLayerParams *)&_SlidingWindowsLayerParams_default_instance_;
          }
          SlidingWindowsLayerParams::MergeFrom(this_x00107,LVar4.slidingwindows_);
        }
        else if (uVar2 == 0x3f7) {
          this_x00145 = mutable_topk(this);
          if (*puVar1 == 0x3f7) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_TopKLayerParams_default_instance_;
          }
          TopKLayerParams::MergeFrom(this_x00145,LVar4.topk_);
        }
        else if (uVar2 == 0x3fc) {
          this_05 = mutable_argmin(this);
          if (*puVar1 == 0x3fc) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_ArgMinLayerParams_default_instance_;
          }
          ArgMinLayerParams::MergeFrom(this_05,LVar4.argmin_);
        }
      }
      else if ((int)uVar2 < 0x415) {
        if (uVar2 == 0x401) {
          this_x00137 = mutable_argmax(this);
          if (*puVar1 == 0x401) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_ArgMaxLayerParams_default_instance_;
          }
          ArgMaxLayerParams::MergeFrom(this_x00137,LVar4.argmax_);
        }
        else if (uVar2 == 0x410) {
          this_56 = mutable_embeddingnd(this);
          if (*puVar1 == 0x410) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ =
                 (ConvolutionLayerParams *)&_EmbeddingNDLayerParams_default_instance_;
          }
          EmbeddingNDLayerParams::MergeFrom(this_56,LVar4.embeddingnd_);
        }
      }
      else if (uVar2 == 0x415) {
        this_x00114 = mutable_batchedmatmul(this);
        if (*puVar1 == 0x415) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ =
               (ConvolutionLayerParams *)&_BatchedMatMulLayerParams_default_instance_;
        }
        BatchedMatMulLayerParams::MergeFrom(this_x00114,LVar4.batchedmatmul_);
      }
      else if (uVar2 == 0x429) {
        this_x00152 = mutable_getshape(this);
        if (*puVar1 == 0x429) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_GetShapeLayerParams_default_instance_;
        }
        GetShapeLayerParams::MergeFrom(this_x00152,LVar4.getshape_);
      }
      else if (uVar2 == 0x42e) {
        this_24 = mutable_loadconstantnd(this);
        if (*puVar1 == 0x42e) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ =
               (ConvolutionLayerParams *)&_LoadConstantNDLayerParams_default_instance_;
        }
        LoadConstantNDLayerParams::MergeFrom(this_24,LVar4.loadconstantnd_);
      }
    }
    else if ((int)uVar2 < 0x456) {
      if ((int)uVar2 < 0x442) {
        if (uVar2 == 0x438) {
          this_x00133 = mutable_filllike(this);
          if (*puVar1 == 0x438) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_FillLikeLayerParams_default_instance_;
          }
          FillLikeLayerParams::MergeFrom(this_x00133,LVar4.filllike_);
        }
        else if (uVar2 == 0x43d) {
          this_52 = mutable_fillstatic(this);
          if (*puVar1 == 0x43d) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_FillStaticLayerParams_default_instance_
            ;
          }
          FillStaticLayerParams::MergeFrom(this_52,LVar4.fillstatic_);
        }
      }
      else if (uVar2 == 0x442) {
        this_x00110 = mutable_filldynamic(this);
        if (*puVar1 == 0x442) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_FillDynamicLayerParams_default_instance_;
        }
        FillDynamicLayerParams::MergeFrom(this_x00110,LVar4.filldynamic_);
      }
      else if (uVar2 == 0x44c) {
        this_x00148 = mutable_broadcasttolike(this);
        if (*puVar1 == 0x44c) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ =
               (ConvolutionLayerParams *)&_BroadcastToLikeLayerParams_default_instance_;
        }
        BroadcastToLikeLayerParams::MergeFrom(this_x00148,LVar4.broadcasttolike_);
      }
      else if (uVar2 == 0x451) {
        this_13 = mutable_broadcasttostatic(this);
        if (*puVar1 == 0x451) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ =
               (ConvolutionLayerParams *)&_BroadcastToStaticLayerParams_default_instance_;
        }
        BroadcastToStaticLayerParams::MergeFrom(this_13,LVar4.broadcasttostatic_);
      }
    }
    else if ((int)uVar2 < 0x465) {
      if (uVar2 == 0x456) {
        this_x00141 = mutable_broadcasttodynamic(this);
        if (*puVar1 == 0x456) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ =
               (ConvolutionLayerParams *)&_BroadcastToDynamicLayerParams_default_instance_;
        }
        BroadcastToDynamicLayerParams::MergeFrom(this_x00141,LVar4.broadcasttodynamic_);
      }
      else if (uVar2 == 0x460) {
        this_60 = mutable_squeeze(this);
        if (*puVar1 == 0x460) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_SqueezeLayerParams_default_instance_;
        }
        SqueezeLayerParams::MergeFrom(this_60,LVar4.squeeze_);
      }
    }
    else if (uVar2 == 0x465) {
      this_x00118 = mutable_expanddims(this);
      if (*puVar1 == 0x465) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ = (ConvolutionLayerParams *)&_ExpandDimsLayerParams_default_instance_;
      }
      ExpandDimsLayerParams::MergeFrom(this_x00118,LVar4.expanddims_);
    }
    else if (uVar2 == 0x46a) {
      this_x00156 = mutable_flattento2d(this);
      if (*puVar1 == 0x46a) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ = (ConvolutionLayerParams *)&_FlattenTo2DLayerParams_default_instance_;
      }
      FlattenTo2DLayerParams::MergeFrom(this_x00156,LVar4.flattento2d_);
    }
    else if (uVar2 == 0x46f) {
      this_28 = mutable_reshapelike(this);
      if (*puVar1 == 0x46f) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ = (ConvolutionLayerParams *)&_ReshapeLikeLayerParams_default_instance_;
      }
      ReshapeLikeLayerParams::MergeFrom(this_28,LVar4.reshapelike_);
    }
  }
  else if ((int)uVar2 < 0x4fb) {
    if ((int)uVar2 < 0x4b0) {
      if ((int)uVar2 < 0x492) {
        if ((int)uVar2 < 0x47e) {
          if (uVar2 == 0x474) {
            this_x00123 = mutable_reshapestatic(this);
            if (*puVar1 == 0x474) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_ReshapeStaticLayerParams_default_instance_;
            }
            ReshapeStaticLayerParams::MergeFrom(this_x00123,LVar4.reshapestatic_);
          }
          else if (uVar2 == 0x479) {
            this_30 = mutable_reshapedynamic(this);
            if (*puVar1 == 0x479) {
              LVar4 = from->layer_;
            }
            else {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              LVar4.convolution_ =
                   (ConvolutionLayerParams *)&_ReshapeDynamicLayerParams_default_instance_;
            }
            ReshapeDynamicLayerParams::MergeFrom(this_30,LVar4.reshapedynamic_);
          }
        }
        else if (uVar2 == 0x47e) {
          this_x00124 = mutable_rankpreservingreshape(this);
          if (*puVar1 == 0x47e) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ =
                 (ConvolutionLayerParams *)&_RankPreservingReshapeLayerParams_default_instance_;
          }
          RankPreservingReshapeLayerParams::MergeFrom(this_x00124,LVar4.rankpreservingreshape_);
        }
        else if (uVar2 == 0x483) {
          this_44 = mutable_constantpad(this);
          if (*puVar1 == 0x483) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ =
                 (ConvolutionLayerParams *)&_ConstantPaddingLayerParams_default_instance_;
          }
          ConstantPaddingLayerParams::MergeFrom(this_44,LVar4.constantpad_);
        }
      }
      else if ((int)uVar2 < 0x49c) {
        if (uVar2 == 0x492) {
          this_x00125 = mutable_randomnormallike(this);
          if (*puVar1 == 0x492) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ =
                 (ConvolutionLayerParams *)&_RandomNormalLikeLayerParams_default_instance_;
          }
          RandomNormalLikeLayerParams::MergeFrom(this_x00125,LVar4.randomnormallike_);
        }
        else if (uVar2 == 0x497) {
          this_45 = mutable_randomnormalstatic(this);
          if (*puVar1 == 0x497) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ =
                 (ConvolutionLayerParams *)&_RandomNormalStaticLayerParams_default_instance_;
          }
          RandomNormalStaticLayerParams::MergeFrom(this_45,LVar4.randomnormalstatic_);
        }
      }
      else if (uVar2 == 0x49c) {
        this_x00100 = mutable_randomnormaldynamic(this);
        if (*puVar1 == 0x49c) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ =
               (ConvolutionLayerParams *)&_RandomNormalDynamicLayerParams_default_instance_;
        }
        RandomNormalDynamicLayerParams::MergeFrom(this_x00100,LVar4.randomnormaldynamic_);
      }
      else if (uVar2 == 0x4a6) {
        this_x00126 = mutable_randomuniformlike(this);
        if (*puVar1 == 0x4a6) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ =
               (ConvolutionLayerParams *)&_RandomUniformLikeLayerParams_default_instance_;
        }
        RandomUniformLikeLayerParams::MergeFrom(this_x00126,LVar4.randomuniformlike_);
      }
      else if (uVar2 == 0x4ab) {
        this_14 = mutable_randomuniformstatic(this);
        if (*puVar1 == 0x4ab) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ =
               (ConvolutionLayerParams *)&_RandomUniformStaticLayerParams_default_instance_;
        }
        RandomUniformStaticLayerParams::MergeFrom(this_14,LVar4.randomuniformstatic_);
      }
    }
    else if ((int)uVar2 < 0x4e2) {
      if ((int)uVar2 < 0x4bf) {
        if (uVar2 == 0x4b0) {
          this_92 = mutable_randomuniformdynamic(this);
          if (*puVar1 == 0x4b0) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ =
                 (ConvolutionLayerParams *)&_RandomUniformDynamicLayerParams_default_instance_;
          }
          RandomUniformDynamicLayerParams::MergeFrom(this_92,LVar4.randomuniformdynamic_);
        }
        else if (uVar2 == 0x4ba) {
          this_40 = mutable_randombernoullilike(this);
          if (*puVar1 == 0x4ba) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ =
                 (ConvolutionLayerParams *)&_RandomBernoulliLikeLayerParams_default_instance_;
          }
          RandomBernoulliLikeLayerParams::MergeFrom(this_40,LVar4.randombernoullilike_);
        }
      }
      else if (uVar2 == 0x4bf) {
        this_81 = mutable_randombernoullistatic(this);
        if (*puVar1 == 0x4bf) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ =
               (ConvolutionLayerParams *)&_RandomBernoulliStaticLayerParams_default_instance_;
        }
        RandomBernoulliStaticLayerParams::MergeFrom(this_81,LVar4.randombernoullistatic_);
      }
      else if (uVar2 == 0x4c4) {
        this_x00102 = mutable_randombernoullidynamic(this);
        if (*puVar1 == 0x4c4) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ =
               (ConvolutionLayerParams *)&_RandomBernoulliDynamicLayerParams_default_instance_;
        }
        RandomBernoulliDynamicLayerParams::MergeFrom(this_x00102,LVar4.randombernoullidynamic_);
      }
      else if (uVar2 == 0x4ce) {
        this_07 = mutable_categoricaldistribution(this);
        if (*puVar1 == 0x4ce) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ =
               (ConvolutionLayerParams *)&_CategoricalDistributionLayerParams_default_instance_;
        }
        CategoricalDistributionLayerParams::MergeFrom(this_07,LVar4.categoricaldistribution_);
      }
    }
    else if ((int)uVar2 < 0x4ec) {
      if (uVar2 == 0x4e2) {
        this_93 = mutable_reducel1(this);
        if (*puVar1 == 0x4e2) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_ReduceL1LayerParams_default_instance_;
        }
        ReduceL1LayerParams::MergeFrom(this_93,LVar4.reducel1_);
      }
      else if (uVar2 == 0x4e7) {
        this_41 = mutable_reducel2(this);
        if (*puVar1 == 0x4e7) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_ReduceL2LayerParams_default_instance_;
        }
        ReduceL2LayerParams::MergeFrom(this_41,LVar4.reducel2_);
      }
    }
    else if (uVar2 == 0x4ec) {
      this_82 = mutable_reducemax(this);
      if (*puVar1 == 0x4ec) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ = (ConvolutionLayerParams *)&_ReduceMaxLayerParams_default_instance_;
      }
      ReduceMaxLayerParams::MergeFrom(this_82,LVar4.reducemax_);
    }
    else if (uVar2 == 0x4f1) {
      this_x00103 = mutable_reducemin(this);
      if (*puVar1 == 0x4f1) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ = (ConvolutionLayerParams *)&_ReduceMinLayerParams_default_instance_;
      }
      ReduceMinLayerParams::MergeFrom(this_x00103,LVar4.reducemin_);
    }
    else if (uVar2 == 0x4f6) {
      this_20 = mutable_reducesum(this);
      if (*puVar1 == 0x4f6) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ = (ConvolutionLayerParams *)&_ReduceSumLayerParams_default_instance_;
      }
      ReduceSumLayerParams::MergeFrom(this_20,LVar4.reducesum_);
    }
  }
  else if ((int)uVar2 < 0x546) {
    if ((int)uVar2 < 0x521) {
      if ((int)uVar2 < 0x505) {
        if (uVar2 == 0x4fb) {
          this_85 = mutable_reduceprod(this);
          if (*puVar1 == 0x4fb) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_ReduceProdLayerParams_default_instance_
            ;
          }
          ReduceProdLayerParams::MergeFrom(this_85,LVar4.reduceprod_);
        }
        else if (uVar2 == 0x500) {
          this_33 = mutable_reducemean(this);
          if (*puVar1 == 0x500) {
            LVar4 = from->layer_;
          }
          else {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            LVar4.convolution_ = (ConvolutionLayerParams *)&_ReduceMeanLayerParams_default_instance_
            ;
          }
          ReduceMeanLayerParams::MergeFrom(this_33,LVar4.reducemean_);
        }
      }
      else if (uVar2 == 0x505) {
        this_75 = mutable_reducelogsum(this);
        if (*puVar1 == 0x505) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_ReduceLogSumLayerParams_default_instance_
          ;
        }
        ReduceLogSumLayerParams::MergeFrom(this_75,LVar4.reducelogsum_);
      }
      else if (uVar2 == 0x50a) {
        this_95 = mutable_reducesumsquare(this);
        if (*puVar1 == 0x50a) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ =
               (ConvolutionLayerParams *)&_ReduceSumSquareLayerParams_default_instance_;
        }
        ReduceSumSquareLayerParams::MergeFrom(this_95,LVar4.reducesumsquare_);
      }
      else if (uVar2 == 0x50f) {
        this_03 = mutable_reducelogsumexp(this);
        if (*puVar1 == 0x50f) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ =
               (ConvolutionLayerParams *)&_ReduceLogSumExpLayerParams_default_instance_;
        }
        ReduceLogSumExpLayerParams::MergeFrom(this_03,LVar4.reducelogsumexp_);
      }
    }
    else if ((int)uVar2 < 0x528) {
      if (uVar2 == 0x521) {
        this_88 = mutable_wherenonzero(this);
        if (*puVar1 == 0x521) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ = (ConvolutionLayerParams *)&_WhereNonZeroLayerParams_default_instance_
          ;
        }
        WhereNonZeroLayerParams::MergeFrom(this_88,LVar4.wherenonzero_);
      }
      else if (uVar2 == 0x523) {
        this_36 = mutable_matrixbandpart(this);
        if (*puVar1 == 0x523) {
          LVar4 = from->layer_;
        }
        else {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          LVar4.convolution_ =
               (ConvolutionLayerParams *)&_MatrixBandPartLayerParams_default_instance_;
        }
        MatrixBandPartLayerParams::MergeFrom(this_36,LVar4.matrixbandpart_);
      }
    }
    else if (uVar2 == 0x528) {
      this_78 = mutable_lowertriangular(this);
      if (*puVar1 == 0x528) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ =
             (ConvolutionLayerParams *)&_LowerTriangularLayerParams_default_instance_;
      }
      LowerTriangularLayerParams::MergeFrom(this_78,LVar4.lowertriangular_);
    }
    else if (uVar2 == 0x52d) {
      this_98 = mutable_uppertriangular(this);
      if (*puVar1 == 0x52d) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ =
             (ConvolutionLayerParams *)&_UpperTriangularLayerParams_default_instance_;
      }
      UpperTriangularLayerParams::MergeFrom(this_98,LVar4.uppertriangular_);
    }
    else if (uVar2 == 0x532) {
      this_17 = mutable_wherebroadcastable(this);
      if (*puVar1 == 0x532) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ =
             (ConvolutionLayerParams *)&_WhereBroadcastableLayerParams_default_instance_;
      }
      WhereBroadcastableLayerParams::MergeFrom(this_17,LVar4.wherebroadcastable_);
    }
  }
  else if ((int)uVar2 < 0x5af) {
    if (uVar2 == 0x546) {
      this_90 = mutable_layernormalization(this);
      if (*puVar1 == 0x546) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ =
             (ConvolutionLayerParams *)&_LayerNormalizationLayerParams_default_instance_;
      }
      LayerNormalizationLayerParams::MergeFrom(this_90,LVar4.layernormalization_);
    }
    else if (uVar2 == 0x578) {
      this_83 = mutable_nonmaximumsuppression(this);
      if (*puVar1 == 0x578) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ =
             (ConvolutionLayerParams *)&_NonMaximumSuppressionLayerParams_default_instance_;
      }
      NonMaximumSuppressionLayerParams::MergeFrom(this_83,LVar4.nonmaximumsuppression_);
    }
    else if (uVar2 == 0x5aa) {
      this_31 = mutable_onehot(this);
      if (*puVar1 == 0x5aa) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ = (ConvolutionLayerParams *)&_OneHotLayerParams_default_instance_;
      }
      OneHotLayerParams::MergeFrom(this_31,LVar4.onehot_);
    }
  }
  else {
    switch(uVar2) {
    case 0x5af:
      this_09 = mutable_cumsum(this);
      if (*puVar1 == 0x5af) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ = (ConvolutionLayerParams *)&_CumSumLayerParams_default_instance_;
      }
      CumSumLayerParams::MergeFrom(this_09,LVar4.cumsum_);
      break;
    case 0x5b4:
      this_72 = mutable_clampedrelu(this);
      if (*puVar1 == 0x5b4) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ = (ConvolutionLayerParams *)&_ClampedReLULayerParams_default_instance_;
      }
      ClampedReLULayerParams::MergeFrom(this_72,LVar4.clampedrelu_);
      break;
    case 0x5b5:
      this_70 = mutable_argsort(this);
      if (*puVar1 == 0x5b5) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ = (ConvolutionLayerParams *)&_ArgSortLayerParams_default_instance_;
      }
      ArgSortLayerParams::MergeFrom(this_70,LVar4.argsort_);
      break;
    case 0x5b9:
      this_69 = mutable_pooling3d(this);
      if (*puVar1 == 0x5b9) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ = (ConvolutionLayerParams *)&_Pooling3DLayerParams_default_instance_;
      }
      Pooling3DLayerParams::MergeFrom(this_69,LVar4.pooling3d_);
      break;
    case 0x5ba:
      this_73 = mutable_globalpooling3d(this);
      if (*puVar1 == 0x5ba) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ =
             (ConvolutionLayerParams *)&_GlobalPooling3DLayerParams_default_instance_;
      }
      GlobalPooling3DLayerParams::MergeFrom(this_73,LVar4.globalpooling3d_);
      break;
    case 0x5be:
      this_71 = mutable_slicebysize(this);
      if (*puVar1 == 0x5be) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ = (ConvolutionLayerParams *)&_SliceBySizeLayerParams_default_instance_;
      }
      SliceBySizeLayerParams::MergeFrom(this_71,LVar4.slicebysize_);
      break;
    case 0x5bf:
      this_68 = mutable_convolution3d(this);
      if (*puVar1 == 0x5bf) {
        LVar4 = from->layer_;
      }
      else {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        LVar4.convolution_ = (ConvolutionLayerParams *)&_Convolution3DLayerParams_default_instance_;
      }
      Convolution3DLayerParams::MergeFrom(this_68,LVar4.convolution3d_);
    }
  }
  return;
}

Assistant:

NeuralNetworkLayer::NeuralNetworkLayer(const NeuralNetworkLayer& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      input_(from.input_),
      output_(from.output_),
      inputtensor_(from.inputtensor_),
      outputtensor_(from.outputtensor_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.name().size() > 0) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  isupdatable_ = from.isupdatable_;
  clear_has_layer();
  switch (from.layer_case()) {
    case kConvolution: {
      mutable_convolution()->::CoreML::Specification::ConvolutionLayerParams::MergeFrom(from.convolution());
      break;
    }
    case kPooling: {
      mutable_pooling()->::CoreML::Specification::PoolingLayerParams::MergeFrom(from.pooling());
      break;
    }
    case kActivation: {
      mutable_activation()->::CoreML::Specification::ActivationParams::MergeFrom(from.activation());
      break;
    }
    case kInnerProduct: {
      mutable_innerproduct()->::CoreML::Specification::InnerProductLayerParams::MergeFrom(from.innerproduct());
      break;
    }
    case kEmbedding: {
      mutable_embedding()->::CoreML::Specification::EmbeddingLayerParams::MergeFrom(from.embedding());
      break;
    }
    case kBatchnorm: {
      mutable_batchnorm()->::CoreML::Specification::BatchnormLayerParams::MergeFrom(from.batchnorm());
      break;
    }
    case kMvn: {
      mutable_mvn()->::CoreML::Specification::MeanVarianceNormalizeLayerParams::MergeFrom(from.mvn());
      break;
    }
    case kL2Normalize: {
      mutable_l2normalize()->::CoreML::Specification::L2NormalizeLayerParams::MergeFrom(from.l2normalize());
      break;
    }
    case kSoftmax: {
      mutable_softmax()->::CoreML::Specification::SoftmaxLayerParams::MergeFrom(from.softmax());
      break;
    }
    case kLrn: {
      mutable_lrn()->::CoreML::Specification::LRNLayerParams::MergeFrom(from.lrn());
      break;
    }
    case kCrop: {
      mutable_crop()->::CoreML::Specification::CropLayerParams::MergeFrom(from.crop());
      break;
    }
    case kPadding: {
      mutable_padding()->::CoreML::Specification::PaddingLayerParams::MergeFrom(from.padding());
      break;
    }
    case kUpsample: {
      mutable_upsample()->::CoreML::Specification::UpsampleLayerParams::MergeFrom(from.upsample());
      break;
    }
    case kResizeBilinear: {
      mutable_resizebilinear()->::CoreML::Specification::ResizeBilinearLayerParams::MergeFrom(from.resizebilinear());
      break;
    }
    case kCropResize: {
      mutable_cropresize()->::CoreML::Specification::CropResizeLayerParams::MergeFrom(from.cropresize());
      break;
    }
    case kUnary: {
      mutable_unary()->::CoreML::Specification::UnaryFunctionLayerParams::MergeFrom(from.unary());
      break;
    }
    case kAdd: {
      mutable_add()->::CoreML::Specification::AddLayerParams::MergeFrom(from.add());
      break;
    }
    case kMultiply: {
      mutable_multiply()->::CoreML::Specification::MultiplyLayerParams::MergeFrom(from.multiply());
      break;
    }
    case kAverage: {
      mutable_average()->::CoreML::Specification::AverageLayerParams::MergeFrom(from.average());
      break;
    }
    case kScale: {
      mutable_scale()->::CoreML::Specification::ScaleLayerParams::MergeFrom(from.scale());
      break;
    }
    case kBias: {
      mutable_bias()->::CoreML::Specification::BiasLayerParams::MergeFrom(from.bias());
      break;
    }
    case kMax: {
      mutable_max()->::CoreML::Specification::MaxLayerParams::MergeFrom(from.max());
      break;
    }
    case kMin: {
      mutable_min()->::CoreML::Specification::MinLayerParams::MergeFrom(from.min());
      break;
    }
    case kDot: {
      mutable_dot()->::CoreML::Specification::DotProductLayerParams::MergeFrom(from.dot());
      break;
    }
    case kReduce: {
      mutable_reduce()->::CoreML::Specification::ReduceLayerParams::MergeFrom(from.reduce());
      break;
    }
    case kLoadConstant: {
      mutable_loadconstant()->::CoreML::Specification::LoadConstantLayerParams::MergeFrom(from.loadconstant());
      break;
    }
    case kReshape: {
      mutable_reshape()->::CoreML::Specification::ReshapeLayerParams::MergeFrom(from.reshape());
      break;
    }
    case kFlatten: {
      mutable_flatten()->::CoreML::Specification::FlattenLayerParams::MergeFrom(from.flatten());
      break;
    }
    case kPermute: {
      mutable_permute()->::CoreML::Specification::PermuteLayerParams::MergeFrom(from.permute());
      break;
    }
    case kConcat: {
      mutable_concat()->::CoreML::Specification::ConcatLayerParams::MergeFrom(from.concat());
      break;
    }
    case kSplit: {
      mutable_split()->::CoreML::Specification::SplitLayerParams::MergeFrom(from.split());
      break;
    }
    case kSequenceRepeat: {
      mutable_sequencerepeat()->::CoreML::Specification::SequenceRepeatLayerParams::MergeFrom(from.sequencerepeat());
      break;
    }
    case kReorganizeData: {
      mutable_reorganizedata()->::CoreML::Specification::ReorganizeDataLayerParams::MergeFrom(from.reorganizedata());
      break;
    }
    case kSlice: {
      mutable_slice()->::CoreML::Specification::SliceLayerParams::MergeFrom(from.slice());
      break;
    }
    case kSimpleRecurrent: {
      mutable_simplerecurrent()->::CoreML::Specification::SimpleRecurrentLayerParams::MergeFrom(from.simplerecurrent());
      break;
    }
    case kGru: {
      mutable_gru()->::CoreML::Specification::GRULayerParams::MergeFrom(from.gru());
      break;
    }
    case kUniDirectionalLSTM: {
      mutable_unidirectionallstm()->::CoreML::Specification::UniDirectionalLSTMLayerParams::MergeFrom(from.unidirectionallstm());
      break;
    }
    case kBiDirectionalLSTM: {
      mutable_bidirectionallstm()->::CoreML::Specification::BiDirectionalLSTMLayerParams::MergeFrom(from.bidirectionallstm());
      break;
    }
    case kCustom: {
      mutable_custom()->::CoreML::Specification::CustomLayerParams::MergeFrom(from.custom());
      break;
    }
    case kCopy: {
      mutable_copy()->::CoreML::Specification::CopyLayerParams::MergeFrom(from.copy());
      break;
    }
    case kBranch: {
      mutable_branch()->::CoreML::Specification::BranchLayerParams::MergeFrom(from.branch());
      break;
    }
    case kLoop: {
      mutable_loop()->::CoreML::Specification::LoopLayerParams::MergeFrom(from.loop());
      break;
    }
    case kLoopBreak: {
      mutable_loopbreak()->::CoreML::Specification::LoopBreakLayerParams::MergeFrom(from.loopbreak());
      break;
    }
    case kLoopContinue: {
      mutable_loopcontinue()->::CoreML::Specification::LoopContinueLayerParams::MergeFrom(from.loopcontinue());
      break;
    }
    case kRangeStatic: {
      mutable_rangestatic()->::CoreML::Specification::RangeStaticLayerParams::MergeFrom(from.rangestatic());
      break;
    }
    case kRangeDynamic: {
      mutable_rangedynamic()->::CoreML::Specification::RangeDynamicLayerParams::MergeFrom(from.rangedynamic());
      break;
    }
    case kClip: {
      mutable_clip()->::CoreML::Specification::ClipLayerParams::MergeFrom(from.clip());
      break;
    }
    case kCeil: {
      mutable_ceil()->::CoreML::Specification::CeilLayerParams::MergeFrom(from.ceil());
      break;
    }
    case kFloor: {
      mutable_floor()->::CoreML::Specification::FloorLayerParams::MergeFrom(from.floor());
      break;
    }
    case kSign: {
      mutable_sign()->::CoreML::Specification::SignLayerParams::MergeFrom(from.sign());
      break;
    }
    case kRound: {
      mutable_round()->::CoreML::Specification::RoundLayerParams::MergeFrom(from.round());
      break;
    }
    case kExp2: {
      mutable_exp2()->::CoreML::Specification::Exp2LayerParams::MergeFrom(from.exp2());
      break;
    }
    case kSin: {
      mutable_sin()->::CoreML::Specification::SinLayerParams::MergeFrom(from.sin());
      break;
    }
    case kCos: {
      mutable_cos()->::CoreML::Specification::CosLayerParams::MergeFrom(from.cos());
      break;
    }
    case kTan: {
      mutable_tan()->::CoreML::Specification::TanLayerParams::MergeFrom(from.tan());
      break;
    }
    case kAsin: {
      mutable_asin()->::CoreML::Specification::AsinLayerParams::MergeFrom(from.asin());
      break;
    }
    case kAcos: {
      mutable_acos()->::CoreML::Specification::AcosLayerParams::MergeFrom(from.acos());
      break;
    }
    case kAtan: {
      mutable_atan()->::CoreML::Specification::AtanLayerParams::MergeFrom(from.atan());
      break;
    }
    case kSinh: {
      mutable_sinh()->::CoreML::Specification::SinhLayerParams::MergeFrom(from.sinh());
      break;
    }
    case kCosh: {
      mutable_cosh()->::CoreML::Specification::CoshLayerParams::MergeFrom(from.cosh());
      break;
    }
    case kTanh: {
      mutable_tanh()->::CoreML::Specification::TanhLayerParams::MergeFrom(from.tanh());
      break;
    }
    case kAsinh: {
      mutable_asinh()->::CoreML::Specification::AsinhLayerParams::MergeFrom(from.asinh());
      break;
    }
    case kAcosh: {
      mutable_acosh()->::CoreML::Specification::AcoshLayerParams::MergeFrom(from.acosh());
      break;
    }
    case kAtanh: {
      mutable_atanh()->::CoreML::Specification::AtanhLayerParams::MergeFrom(from.atanh());
      break;
    }
    case kErf: {
      mutable_erf()->::CoreML::Specification::ErfLayerParams::MergeFrom(from.erf());
      break;
    }
    case kGelu: {
      mutable_gelu()->::CoreML::Specification::GeluLayerParams::MergeFrom(from.gelu());
      break;
    }
    case kEqual: {
      mutable_equal()->::CoreML::Specification::EqualLayerParams::MergeFrom(from.equal());
      break;
    }
    case kNotEqual: {
      mutable_notequal()->::CoreML::Specification::NotEqualLayerParams::MergeFrom(from.notequal());
      break;
    }
    case kLessThan: {
      mutable_lessthan()->::CoreML::Specification::LessThanLayerParams::MergeFrom(from.lessthan());
      break;
    }
    case kLessEqual: {
      mutable_lessequal()->::CoreML::Specification::LessEqualLayerParams::MergeFrom(from.lessequal());
      break;
    }
    case kGreaterThan: {
      mutable_greaterthan()->::CoreML::Specification::GreaterThanLayerParams::MergeFrom(from.greaterthan());
      break;
    }
    case kGreaterEqual: {
      mutable_greaterequal()->::CoreML::Specification::GreaterEqualLayerParams::MergeFrom(from.greaterequal());
      break;
    }
    case kLogicalOr: {
      mutable_logicalor()->::CoreML::Specification::LogicalOrLayerParams::MergeFrom(from.logicalor());
      break;
    }
    case kLogicalXor: {
      mutable_logicalxor()->::CoreML::Specification::LogicalXorLayerParams::MergeFrom(from.logicalxor());
      break;
    }
    case kLogicalNot: {
      mutable_logicalnot()->::CoreML::Specification::LogicalNotLayerParams::MergeFrom(from.logicalnot());
      break;
    }
    case kLogicalAnd: {
      mutable_logicaland()->::CoreML::Specification::LogicalAndLayerParams::MergeFrom(from.logicaland());
      break;
    }
    case kModBroadcastable: {
      mutable_modbroadcastable()->::CoreML::Specification::ModBroadcastableLayerParams::MergeFrom(from.modbroadcastable());
      break;
    }
    case kMinBroadcastable: {
      mutable_minbroadcastable()->::CoreML::Specification::MinBroadcastableLayerParams::MergeFrom(from.minbroadcastable());
      break;
    }
    case kMaxBroadcastable: {
      mutable_maxbroadcastable()->::CoreML::Specification::MaxBroadcastableLayerParams::MergeFrom(from.maxbroadcastable());
      break;
    }
    case kAddBroadcastable: {
      mutable_addbroadcastable()->::CoreML::Specification::AddBroadcastableLayerParams::MergeFrom(from.addbroadcastable());
      break;
    }
    case kPowBroadcastable: {
      mutable_powbroadcastable()->::CoreML::Specification::PowBroadcastableLayerParams::MergeFrom(from.powbroadcastable());
      break;
    }
    case kDivideBroadcastable: {
      mutable_dividebroadcastable()->::CoreML::Specification::DivideBroadcastableLayerParams::MergeFrom(from.dividebroadcastable());
      break;
    }
    case kFloorDivBroadcastable: {
      mutable_floordivbroadcastable()->::CoreML::Specification::FloorDivBroadcastableLayerParams::MergeFrom(from.floordivbroadcastable());
      break;
    }
    case kMultiplyBroadcastable: {
      mutable_multiplybroadcastable()->::CoreML::Specification::MultiplyBroadcastableLayerParams::MergeFrom(from.multiplybroadcastable());
      break;
    }
    case kSubtractBroadcastable: {
      mutable_subtractbroadcastable()->::CoreML::Specification::SubtractBroadcastableLayerParams::MergeFrom(from.subtractbroadcastable());
      break;
    }
    case kTile: {
      mutable_tile()->::CoreML::Specification::TileLayerParams::MergeFrom(from.tile());
      break;
    }
    case kStack: {
      mutable_stack()->::CoreML::Specification::StackLayerParams::MergeFrom(from.stack());
      break;
    }
    case kGather: {
      mutable_gather()->::CoreML::Specification::GatherLayerParams::MergeFrom(from.gather());
      break;
    }
    case kScatter: {
      mutable_scatter()->::CoreML::Specification::ScatterLayerParams::MergeFrom(from.scatter());
      break;
    }
    case kGatherND: {
      mutable_gathernd()->::CoreML::Specification::GatherNDLayerParams::MergeFrom(from.gathernd());
      break;
    }
    case kScatterND: {
      mutable_scatternd()->::CoreML::Specification::ScatterNDLayerParams::MergeFrom(from.scatternd());
      break;
    }
    case kSoftmaxND: {
      mutable_softmaxnd()->::CoreML::Specification::SoftmaxNDLayerParams::MergeFrom(from.softmaxnd());
      break;
    }
    case kGatherAlongAxis: {
      mutable_gatheralongaxis()->::CoreML::Specification::GatherAlongAxisLayerParams::MergeFrom(from.gatheralongaxis());
      break;
    }
    case kScatterAlongAxis: {
      mutable_scatteralongaxis()->::CoreML::Specification::ScatterAlongAxisLayerParams::MergeFrom(from.scatteralongaxis());
      break;
    }
    case kReverse: {
      mutable_reverse()->::CoreML::Specification::ReverseLayerParams::MergeFrom(from.reverse());
      break;
    }
    case kReverseSeq: {
      mutable_reverseseq()->::CoreML::Specification::ReverseSeqLayerParams::MergeFrom(from.reverseseq());
      break;
    }
    case kSplitND: {
      mutable_splitnd()->::CoreML::Specification::SplitNDLayerParams::MergeFrom(from.splitnd());
      break;
    }
    case kConcatND: {
      mutable_concatnd()->::CoreML::Specification::ConcatNDLayerParams::MergeFrom(from.concatnd());
      break;
    }
    case kTranspose: {
      mutable_transpose()->::CoreML::Specification::TransposeLayerParams::MergeFrom(from.transpose());
      break;
    }
    case kSliceStatic: {
      mutable_slicestatic()->::CoreML::Specification::SliceStaticLayerParams::MergeFrom(from.slicestatic());
      break;
    }
    case kSliceDynamic: {
      mutable_slicedynamic()->::CoreML::Specification::SliceDynamicLayerParams::MergeFrom(from.slicedynamic());
      break;
    }
    case kSlidingWindows: {
      mutable_slidingwindows()->::CoreML::Specification::SlidingWindowsLayerParams::MergeFrom(from.slidingwindows());
      break;
    }
    case kTopK: {
      mutable_topk()->::CoreML::Specification::TopKLayerParams::MergeFrom(from.topk());
      break;
    }
    case kArgMin: {
      mutable_argmin()->::CoreML::Specification::ArgMinLayerParams::MergeFrom(from.argmin());
      break;
    }
    case kArgMax: {
      mutable_argmax()->::CoreML::Specification::ArgMaxLayerParams::MergeFrom(from.argmax());
      break;
    }
    case kEmbeddingND: {
      mutable_embeddingnd()->::CoreML::Specification::EmbeddingNDLayerParams::MergeFrom(from.embeddingnd());
      break;
    }
    case kBatchedMatmul: {
      mutable_batchedmatmul()->::CoreML::Specification::BatchedMatMulLayerParams::MergeFrom(from.batchedmatmul());
      break;
    }
    case kGetShape: {
      mutable_getshape()->::CoreML::Specification::GetShapeLayerParams::MergeFrom(from.getshape());
      break;
    }
    case kLoadConstantND: {
      mutable_loadconstantnd()->::CoreML::Specification::LoadConstantNDLayerParams::MergeFrom(from.loadconstantnd());
      break;
    }
    case kFillLike: {
      mutable_filllike()->::CoreML::Specification::FillLikeLayerParams::MergeFrom(from.filllike());
      break;
    }
    case kFillStatic: {
      mutable_fillstatic()->::CoreML::Specification::FillStaticLayerParams::MergeFrom(from.fillstatic());
      break;
    }
    case kFillDynamic: {
      mutable_filldynamic()->::CoreML::Specification::FillDynamicLayerParams::MergeFrom(from.filldynamic());
      break;
    }
    case kBroadcastToLike: {
      mutable_broadcasttolike()->::CoreML::Specification::BroadcastToLikeLayerParams::MergeFrom(from.broadcasttolike());
      break;
    }
    case kBroadcastToStatic: {
      mutable_broadcasttostatic()->::CoreML::Specification::BroadcastToStaticLayerParams::MergeFrom(from.broadcasttostatic());
      break;
    }
    case kBroadcastToDynamic: {
      mutable_broadcasttodynamic()->::CoreML::Specification::BroadcastToDynamicLayerParams::MergeFrom(from.broadcasttodynamic());
      break;
    }
    case kSqueeze: {
      mutable_squeeze()->::CoreML::Specification::SqueezeLayerParams::MergeFrom(from.squeeze());
      break;
    }
    case kExpandDims: {
      mutable_expanddims()->::CoreML::Specification::ExpandDimsLayerParams::MergeFrom(from.expanddims());
      break;
    }
    case kFlattenTo2D: {
      mutable_flattento2d()->::CoreML::Specification::FlattenTo2DLayerParams::MergeFrom(from.flattento2d());
      break;
    }
    case kReshapeLike: {
      mutable_reshapelike()->::CoreML::Specification::ReshapeLikeLayerParams::MergeFrom(from.reshapelike());
      break;
    }
    case kReshapeStatic: {
      mutable_reshapestatic()->::CoreML::Specification::ReshapeStaticLayerParams::MergeFrom(from.reshapestatic());
      break;
    }
    case kReshapeDynamic: {
      mutable_reshapedynamic()->::CoreML::Specification::ReshapeDynamicLayerParams::MergeFrom(from.reshapedynamic());
      break;
    }
    case kRankPreservingReshape: {
      mutable_rankpreservingreshape()->::CoreML::Specification::RankPreservingReshapeLayerParams::MergeFrom(from.rankpreservingreshape());
      break;
    }
    case kConstantPad: {
      mutable_constantpad()->::CoreML::Specification::ConstantPaddingLayerParams::MergeFrom(from.constantpad());
      break;
    }
    case kRandomNormalLike: {
      mutable_randomnormallike()->::CoreML::Specification::RandomNormalLikeLayerParams::MergeFrom(from.randomnormallike());
      break;
    }
    case kRandomNormalStatic: {
      mutable_randomnormalstatic()->::CoreML::Specification::RandomNormalStaticLayerParams::MergeFrom(from.randomnormalstatic());
      break;
    }
    case kRandomNormalDynamic: {
      mutable_randomnormaldynamic()->::CoreML::Specification::RandomNormalDynamicLayerParams::MergeFrom(from.randomnormaldynamic());
      break;
    }
    case kRandomUniformLike: {
      mutable_randomuniformlike()->::CoreML::Specification::RandomUniformLikeLayerParams::MergeFrom(from.randomuniformlike());
      break;
    }
    case kRandomUniformStatic: {
      mutable_randomuniformstatic()->::CoreML::Specification::RandomUniformStaticLayerParams::MergeFrom(from.randomuniformstatic());
      break;
    }
    case kRandomUniformDynamic: {
      mutable_randomuniformdynamic()->::CoreML::Specification::RandomUniformDynamicLayerParams::MergeFrom(from.randomuniformdynamic());
      break;
    }
    case kRandomBernoulliLike: {
      mutable_randombernoullilike()->::CoreML::Specification::RandomBernoulliLikeLayerParams::MergeFrom(from.randombernoullilike());
      break;
    }
    case kRandomBernoulliStatic: {
      mutable_randombernoullistatic()->::CoreML::Specification::RandomBernoulliStaticLayerParams::MergeFrom(from.randombernoullistatic());
      break;
    }
    case kRandomBernoulliDynamic: {
      mutable_randombernoullidynamic()->::CoreML::Specification::RandomBernoulliDynamicLayerParams::MergeFrom(from.randombernoullidynamic());
      break;
    }
    case kCategoricalDistribution: {
      mutable_categoricaldistribution()->::CoreML::Specification::CategoricalDistributionLayerParams::MergeFrom(from.categoricaldistribution());
      break;
    }
    case kReduceL1: {
      mutable_reducel1()->::CoreML::Specification::ReduceL1LayerParams::MergeFrom(from.reducel1());
      break;
    }
    case kReduceL2: {
      mutable_reducel2()->::CoreML::Specification::ReduceL2LayerParams::MergeFrom(from.reducel2());
      break;
    }
    case kReduceMax: {
      mutable_reducemax()->::CoreML::Specification::ReduceMaxLayerParams::MergeFrom(from.reducemax());
      break;
    }
    case kReduceMin: {
      mutable_reducemin()->::CoreML::Specification::ReduceMinLayerParams::MergeFrom(from.reducemin());
      break;
    }
    case kReduceSum: {
      mutable_reducesum()->::CoreML::Specification::ReduceSumLayerParams::MergeFrom(from.reducesum());
      break;
    }
    case kReduceProd: {
      mutable_reduceprod()->::CoreML::Specification::ReduceProdLayerParams::MergeFrom(from.reduceprod());
      break;
    }
    case kReduceMean: {
      mutable_reducemean()->::CoreML::Specification::ReduceMeanLayerParams::MergeFrom(from.reducemean());
      break;
    }
    case kReduceLogSum: {
      mutable_reducelogsum()->::CoreML::Specification::ReduceLogSumLayerParams::MergeFrom(from.reducelogsum());
      break;
    }
    case kReduceSumSquare: {
      mutable_reducesumsquare()->::CoreML::Specification::ReduceSumSquareLayerParams::MergeFrom(from.reducesumsquare());
      break;
    }
    case kReduceLogSumExp: {
      mutable_reducelogsumexp()->::CoreML::Specification::ReduceLogSumExpLayerParams::MergeFrom(from.reducelogsumexp());
      break;
    }
    case kWhereNonZero: {
      mutable_wherenonzero()->::CoreML::Specification::WhereNonZeroLayerParams::MergeFrom(from.wherenonzero());
      break;
    }
    case kMatrixBandPart: {
      mutable_matrixbandpart()->::CoreML::Specification::MatrixBandPartLayerParams::MergeFrom(from.matrixbandpart());
      break;
    }
    case kLowerTriangular: {
      mutable_lowertriangular()->::CoreML::Specification::LowerTriangularLayerParams::MergeFrom(from.lowertriangular());
      break;
    }
    case kUpperTriangular: {
      mutable_uppertriangular()->::CoreML::Specification::UpperTriangularLayerParams::MergeFrom(from.uppertriangular());
      break;
    }
    case kWhereBroadcastable: {
      mutable_wherebroadcastable()->::CoreML::Specification::WhereBroadcastableLayerParams::MergeFrom(from.wherebroadcastable());
      break;
    }
    case kLayerNormalization: {
      mutable_layernormalization()->::CoreML::Specification::LayerNormalizationLayerParams::MergeFrom(from.layernormalization());
      break;
    }
    case kNonMaximumSuppression: {
      mutable_nonmaximumsuppression()->::CoreML::Specification::NonMaximumSuppressionLayerParams::MergeFrom(from.nonmaximumsuppression());
      break;
    }
    case kOneHot: {
      mutable_onehot()->::CoreML::Specification::OneHotLayerParams::MergeFrom(from.onehot());
      break;
    }
    case kCumSum: {
      mutable_cumsum()->::CoreML::Specification::CumSumLayerParams::MergeFrom(from.cumsum());
      break;
    }
    case kClampedReLU: {
      mutable_clampedrelu()->::CoreML::Specification::ClampedReLULayerParams::MergeFrom(from.clampedrelu());
      break;
    }
    case kArgSort: {
      mutable_argsort()->::CoreML::Specification::ArgSortLayerParams::MergeFrom(from.argsort());
      break;
    }
    case kPooling3D: {
      mutable_pooling3d()->::CoreML::Specification::Pooling3DLayerParams::MergeFrom(from.pooling3d());
      break;
    }
    case kGlobalPooling3D: {
      mutable_globalpooling3d()->::CoreML::Specification::GlobalPooling3DLayerParams::MergeFrom(from.globalpooling3d());
      break;
    }
    case kSliceBySize: {
      mutable_slicebysize()->::CoreML::Specification::SliceBySizeLayerParams::MergeFrom(from.slicebysize());
      break;
    }
    case kConvolution3D: {
      mutable_convolution3d()->::CoreML::Specification::Convolution3DLayerParams::MergeFrom(from.convolution3d());
      break;
    }
    case LAYER_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NeuralNetworkLayer)
}